

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-io.cpp
# Opt level: O2

void wasm::readTextData(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *filename,string *input,Module *wasm,IRProfile profile)

{
  pointer pcVar1;
  Module *wasm_00;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_R9;
  string_view in;
  Fatal local_200;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  undefined1 local_50 [8];
  Result<wasm::Ok> parsed;
  
  pcVar1 = (input->_M_dataplus)._M_p;
  wasm_00 = (Module *)input->_M_string_length;
  std::
  _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ::_Optional_base((_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    *)&local_78,
                   &filename->
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  );
  in._M_str = (char *)&local_78;
  in._M_len = (size_t)pcVar1;
  WATParser::parseModule((Result<wasm::Ok> *)local_50,(WATParser *)wasm,wasm_00,in,in_R9);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_78);
  if (parsed.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ != '\x01') {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_50);
    return;
  }
  Fatal::Fatal(&local_200);
  Fatal::operator<<(&local_200,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  Fatal::~Fatal(&local_200);
}

Assistant:

static void readTextData(std::optional<std::string> filename,
                         std::string& input,
                         Module& wasm,
                         IRProfile profile) {
  if (auto parsed = WATParser::parseModule(wasm, input, filename);
      auto err = parsed.getErr()) {
    Fatal() << err->msg;
  }
}